

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

void notice_stuff(player *p)

{
  player *p_local;
  
  if (p->upkeep->notice != 0) {
    if ((p->upkeep->notice & 2) != 0) {
      p->upkeep->notice = p->upkeep->notice & 0xfffffffd;
      ignore_drop(p);
    }
    if ((p->upkeep->notice & 1) != 0) {
      p->upkeep->notice = p->upkeep->notice & 0xfffffffe;
      combine_pack(p);
    }
    if ((p->upkeep->notice & 4) != 0) {
      p->upkeep->notice = p->upkeep->notice & 0xfffffffb;
      show_monster_messages();
    }
  }
  return;
}

Assistant:

void notice_stuff(struct player *p)
{
	/* Notice stuff */
	if (!p->upkeep->notice) return;

	/* Deal with ignore stuff */
	if (p->upkeep->notice & PN_IGNORE) {
		p->upkeep->notice &= ~(PN_IGNORE);
		ignore_drop(p);
	}

	/* Combine the pack */
	if (p->upkeep->notice & PN_COMBINE) {
		p->upkeep->notice &= ~(PN_COMBINE);
		combine_pack(p);
	}

	/* Dump the monster messages */
	if (p->upkeep->notice & PN_MON_MESSAGE) {
		p->upkeep->notice &= ~(PN_MON_MESSAGE);

		/* Make sure this comes after all of the monster messages */
		show_monster_messages();
	}
}